

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O3

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,array *values)

{
  undefined1 local_29;
  MsgPackArray *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (MsgPackArray *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<msgpack11::MsgPackArray,std::allocator<msgpack11::MsgPackArray>,std::vector<msgpack11::MsgPack,std::allocator<msgpack11::MsgPack>>const&>
            (a_Stack_20,&local_28,(allocator<msgpack11::MsgPackArray> *)&local_29,values);
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28;
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_20[0]._M_pi;
  return;
}

Assistant:

MsgPack::MsgPack(const MsgPack::array &values)     : m_ptr(make_shared<MsgPackArray>(values)) {}